

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O0

void __thiscall dense_parameters::shallow_copy(dense_parameters *this,dense_parameters *input)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  if ((*(byte *)((long)in_RDI + 0x14) & 1) == 0) {
    free((void *)*in_RDI);
  }
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RSI + 2);
  *(undefined1 *)((long)in_RDI + 0x14) = 1;
  return;
}

Assistant:

void shallow_copy(const dense_parameters& input)
  {
    if (!_seeded)
      free(_begin);
    _begin = input._begin;
    _weight_mask = input._weight_mask;
    _stride_shift = input._stride_shift;
    _seeded = true;
  }